

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall llbuild::buildsystem::BuildSystem::~BuildSystem(BuildSystem *this)

{
  void *pvVar1;
  
  pvVar1 = this->impl;
  if (pvVar1 != (void *)0x0) {
    llvm::
    StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
    ::~StringMap((StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
                  *)((long)pvVar1 + 0x118));
    core::BuildEngine::~BuildEngine((BuildEngine *)((long)pvVar1 + 0x108));
    anon_unknown.dwarf_643cf::BuildSystemEngineDelegate::~BuildSystemEngineDelegate
              ((BuildSystemEngineDelegate *)((long)pvVar1 + 0x70));
    std::
    unique_ptr<llbuild::buildsystem::BuildDescription,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
    ::~unique_ptr((unique_ptr<llbuild::buildsystem::BuildDescription,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
                   *)((long)pvVar1 + 0x68));
    anon_unknown.dwarf_643cf::BuildSystemFileDelegate::~BuildSystemFileDelegate
              ((BuildSystemFileDelegate *)((long)pvVar1 + 0x38));
    std::__cxx11::string::_M_dispose();
    std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
    ~unique_ptr((unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                 *)((long)pvVar1 + 0x10));
  }
  operator_delete(pvVar1,0x138);
  return;
}

Assistant:

BuildSystem::~BuildSystem() {
  delete static_cast<BuildSystemImpl*>(impl);
}